

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_base64.cpp
# Opt level: O0

void __thiscall Base64_RoundTrip_Test::Base64_RoundTrip_Test(Base64_RoundTrip_Test *this)

{
  Base64_RoundTrip_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Base64_RoundTrip_Test_00319a18;
  return;
}

Assistant:

TEST (Base64, RoundTrip) {
    std::vector<std::uint8_t> input;
    input.reserve (256);
    auto value = std::uint8_t{0};
    std::generate_n (std::back_inserter (input), 256, [&value] () { return value++; });

    std::string encoded;
    pstore::to_base64 (std::begin (input), std::end (input), std::back_inserter (encoded));

    auto const expected =
        "AAECAwQFBgcICQoLDA0ODxAREhMUFRYXGBkaGxwdHh8gISIjJCUmJygpKissLS4vMDEyMzQ1Njc4OTo7"
        "PD0+P0BBQkNERUZHSElKS0xNTk9QUVJTVFVWV1hZWltcXV5fYGFiY2RlZmdoaWprbG1ub3BxcnN0dXZ3"
        "eHl6e3x9fn+AgYKDhIWGh4iJiouMjY6PkJGSk5SVlpeYmZqbnJ2en6ChoqOkpaanqKmqq6ytrq+wsbKz"
        "tLW2t7i5uru8vb6/wMHCw8TFxsfIycrLzM3Oz9DR0tPU1dbX2Nna29zd3t/g4eLj5OXm5+jp6uvs7e7v"
        "8PHy8/T19vf4+fr7/P3+/w=="s;

    ASSERT_EQ (expected, encoded);

    std::vector<std::uint8_t> decoded;
    pstore::from_base64 (std::begin (encoded), std::end (encoded), std::back_inserter (decoded));

    EXPECT_EQ (decoded, input);
}